

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O0

MPP_RET iep2_init(IepCtx *ictx)

{
  int iVar1;
  RockchipSocType RVar2;
  MPP_RET MVar3;
  undefined4 local_44;
  undefined4 local_40;
  RK_U32 client_data;
  MppReqV1 mpp_req;
  iep2_api_ctx *ctx;
  MPP_RET ret;
  IepCtx *ictx_local;
  
  mpp_req.data_ptr = (RK_U64)*ictx;
  local_44 = 0x1c;
  mpp_env_get_u32("iep_debug",&iep_debug,0);
  iVar1 = open("/dev/mpp_service",0x80002);
  *(int *)(mpp_req.data_ptr + 0x4f4) = iVar1;
  if (*(int *)(mpp_req.data_ptr + 0x4f4) < 0) {
    _mpp_log_l(2,(char *)0x0,"can NOT find device /dev/iep2\n",(char *)0x0);
    ictx_local._4_4_ = MPP_NOK;
  }
  else {
    local_40 = 0x100;
    client_data = 0;
    mpp_req.cmd = 4;
    mpp_req._8_8_ = &local_44;
    iVar1 = ioctl(*(int *)(mpp_req.data_ptr + 0x4f4),0x40047601,&local_40);
    if (iVar1 == 0) {
      *(undefined4 *)mpp_req.data_ptr = 3;
      *(undefined4 *)(mpp_req.data_ptr + 4) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 8) = 3;
      *(undefined4 *)(mpp_req.data_ptr + 0xc) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x18) = 0xb4;
      *(undefined4 *)(mpp_req.data_ptr + 0x1c) = 0xb4;
      *(undefined4 *)(mpp_req.data_ptr + 0x20) = 0xb4;
      *(undefined4 *)(mpp_req.data_ptr + 0x10) = 0x2d;
      *(undefined4 *)(mpp_req.data_ptr + 0x14) = 0x78;
      *(undefined4 *)(mpp_req.data_ptr + 0x68) = 5;
      *(undefined4 *)(mpp_req.data_ptr + 0x6c) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x70) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x74) = 1;
      *(undefined4 *)(mpp_req.data_ptr + 0x78) = 6;
      RVar2 = mpp_get_soc_type();
      if (RVar2 == ROCKCHIP_SOC_RK3528) {
        mpp_env_get_u32("iep_md_pre_en",&iep_md_pre_en,0);
        if (iep_md_pre_en == 0) {
          *(undefined4 *)(mpp_req.data_ptr + 0x7c) = 8;
        }
        else {
          *(undefined4 *)(mpp_req.data_ptr + 0x7c) = 4;
        }
      }
      else {
        *(undefined4 *)(mpp_req.data_ptr + 0x7c) = 4;
      }
      *(undefined4 *)(mpp_req.data_ptr + 0x80) = 0x1e;
      *(undefined4 *)(mpp_req.data_ptr + 0x84) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x88) = 0x3c;
      *(undefined4 *)(mpp_req.data_ptr + 0x8c) = 0x3c;
      *(undefined4 *)(mpp_req.data_ptr + 0x90) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x94) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0xa4) = 0x14;
      *(undefined4 *)(mpp_req.data_ptr + 0xa0) = 2;
      *(undefined4 *)(mpp_req.data_ptr + 0x128) = 5;
      *(undefined4 *)(mpp_req.data_ptr + 0x130) = 4;
      *(undefined4 *)(mpp_req.data_ptr + 0x134) = 4;
      *(undefined4 *)(mpp_req.data_ptr + 300) = 10;
      *(undefined4 *)(mpp_req.data_ptr + 0x138) = 0x14;
      *(undefined4 *)(mpp_req.data_ptr + 0x13c) = 0x1c;
      *(undefined4 *)(mpp_req.data_ptr + 0x140) = 0x1b;
      *(undefined4 *)(mpp_req.data_ptr + 0x16c) = 0xc;
      memset((void *)(mpp_req.data_ptr + 0x180),1,0x20);
      *(undefined4 *)(mpp_req.data_ptr + 0x17c) = 4;
      *(undefined4 *)(mpp_req.data_ptr + 0x178) = 0x10;
      *(undefined4 *)(mpp_req.data_ptr + 0x174) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x170) = 1;
      *(undefined4 *)(mpp_req.data_ptr + 0x1a0) = 1;
      memcpy((void *)(mpp_req.data_ptr + 0x1a4),iep2_mtn_tab,0x40);
      *(undefined4 *)(mpp_req.data_ptr + 0x1e8) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x1ec) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x68) = 5;
      *(undefined4 *)mpp_req.data_ptr = 3;
      *(undefined4 *)(mpp_req.data_ptr + 4) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 8) = 3;
      *(undefined4 *)(mpp_req.data_ptr + 0xc) = 0;
      *(undefined4 *)(mpp_req.data_ptr + 0x18) = 0xb4;
      *(undefined4 *)(mpp_req.data_ptr + 0x1c) = 0xb4;
      *(undefined4 *)(mpp_req.data_ptr + 0x20) = 0xb4;
      *(undefined4 *)(mpp_req.data_ptr + 0x10) = 0x2d;
      *(undefined4 *)(mpp_req.data_ptr + 0x14) = 0x78;
      memset((void *)(mpp_req.data_ptr + 0x42c),0,0x60);
      memset((void *)(mpp_req.data_ptr + 0x48c),0,0x48);
      *(undefined4 *)(mpp_req.data_ptr + 0x4cc) = 4;
      *(undefined4 *)(mpp_req.data_ptr + 0x4d0) = 0xffffffff;
      ictx_local._4_4_ =
           mpp_buffer_group_get
                     ((MppBufferGroup *)(mpp_req.data_ptr + 0x4d8),MPP_BUFFER_TYPE_DRM,
                      MPP_BUFFER_INTERNAL,(char *)0x0,"iep2_init");
      if (ictx_local._4_4_ == MPP_OK) {
        MVar3 = mpp_buffer_get_with_tag
                          (*(MppBufferGroup *)(mpp_req.data_ptr + 0x4d8),
                           (MppBuffer *)(mpp_req.data_ptr + 0x4e0),0xe100,(char *)0x0,"iep2_init");
        if (MVar3 == MPP_OK) {
          MVar3 = mpp_buffer_get_with_tag
                            (*(MppBufferGroup *)(mpp_req.data_ptr + 0x4d8),
                             (MppBuffer *)(mpp_req.data_ptr + 0x4e8),0x1fe000,(char *)0x0,
                             "iep2_init");
          if (MVar3 == MPP_OK) {
            iVar1 = mpp_buffer_get_fd_with_caller
                              (*(MppBuffer *)(mpp_req.data_ptr + 0x4e0),"iep2_init");
            *(int *)(mpp_req.data_ptr + 0x60) = iVar1;
            iVar1 = mpp_buffer_get_fd_with_caller
                              (*(MppBuffer *)(mpp_req.data_ptr + 0x4e8),"iep2_init");
            *(int *)(mpp_req.data_ptr + 100) = iVar1;
            ictx_local._4_4_ = MPP_OK;
          }
          else {
            close(*(int *)(mpp_req.data_ptr + 0x4f4));
            mpp_buffer_group_put(*(MppBufferGroup *)(mpp_req.data_ptr + 0x4d8));
            mpp_buffer_put_with_caller(*(MppBuffer *)(mpp_req.data_ptr + 0x4e0),"iep2_init");
            _mpp_log_l(2,(char *)0x0,"allocate md buffer failed\n","iep2_init");
            ictx_local._4_4_ = MPP_NOK;
          }
        }
        else {
          close(*(int *)(mpp_req.data_ptr + 0x4f4));
          mpp_buffer_group_put(*(MppBufferGroup *)(mpp_req.data_ptr + 0x4d8));
          _mpp_log_l(2,(char *)0x0,"allocate mv buffer failed\n","iep2_init");
          ictx_local._4_4_ = MPP_NOK;
        }
      }
      else {
        close(*(int *)(mpp_req.data_ptr + 0x4f4));
        _mpp_log_l(2,(char *)0x0,"memGroup mpp_buffer_group_get failed\n",(char *)0x0);
      }
    }
    else {
      _mpp_log_l(2,(char *)0x0,"ioctl set_client failed\n",(char *)0x0);
      ictx_local._4_4_ = MPP_NOK;
    }
  }
  return ictx_local._4_4_;
}

Assistant:

static MPP_RET iep2_init(IepCtx *ictx)
{
    MPP_RET ret;
    struct iep2_api_ctx *ctx = *ictx;
    MppReqV1 mpp_req;
    RK_U32 client_data = IEP_CLIENT_TYPE;

    mpp_env_get_u32("iep_debug", &iep_debug, 0);

    ctx->fd = open("/dev/mpp_service", O_RDWR | O_CLOEXEC);
    if (ctx->fd < 0) {
        mpp_err("can NOT find device /dev/iep2\n");
        return MPP_NOK;
    }

    mpp_req.cmd = MPP_CMD_INIT_CLIENT_TYPE;
    mpp_req.flag = 0;
    mpp_req.size = sizeof(client_data);
    mpp_req.data_ptr = REQ_DATA_PTR(&client_data);

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err("ioctl set_client failed\n");
        return MPP_NOK;
    }

    // set default parameters.
    ctx->params.src_fmt = IEP2_FMT_YUV420;
    ctx->params.src_yuv_swap = IEP2_YUV_SWAP_SP_UV;
    ctx->params.dst_fmt = IEP2_FMT_YUV420;
    ctx->params.dst_yuv_swap = IEP2_YUV_SWAP_SP_UV;

    ctx->params.src_y_stride = 720 / 4;
    ctx->params.src_uv_stride = 720 / 4;
    ctx->params.dst_y_stride = 720 / 4;

    ctx->params.tile_cols = 720 / 16;
    ctx->params.tile_rows = 480 / 4;

    ctx->params.dil_mode = IEP2_DIL_MODE_I1O1T;

    ctx->params.dil_out_mode = IEP2_OUT_MODE_LINE;
    ctx->params.dil_field_order = IEP2_FIELD_ORDER_TFF;

    ctx->params.md_theta = 1;
    ctx->params.md_r = 6;

    if (mpp_get_soc_type() == ROCKCHIP_SOC_RK3528) {
        mpp_env_get_u32("iep_md_pre_en", &iep_md_pre_en, 0);
        if (iep_md_pre_en) {
            ctx->params.md_lambda = 4;
        } else {
            ctx->params.md_lambda = 8;
        }
    } else {
        ctx->params.md_lambda = 4;
    }

    ctx->params.dect_resi_thr = 30;
    ctx->params.osd_area_num = 0;
    ctx->params.osd_gradh_thr = 60;
    ctx->params.osd_gradv_thr = 60;

    ctx->params.osd_pos_limit_en = 0;
    ctx->params.osd_pos_limit_num = 0;

    ctx->params.osd_pec_thr = 20;
    ctx->params.osd_line_num = 2;

    ctx->params.me_pena = 5;
    ctx->params.mv_similar_thr = 4;
    ctx->params.mv_similar_num_thr0 = 4;
    ctx->params.mv_bonus = 10;
    ctx->params.me_thr_offset = 20;

    ctx->params.mv_left_limit = 28;
    ctx->params.mv_right_limit = 27;

    ctx->params.eedi_thr0 = 12;

    memset(ctx->params.comb_osd_vld, 1, sizeof(ctx->params.comb_osd_vld));
    ctx->params.comb_t_thr = 4;
    ctx->params.comb_feature_thr = 16;
    ctx->params.comb_cnt_thr = 0;

    ctx->params.ble_backtoma_num = 1;

    ctx->params.mtn_en = 1;
    memcpy(ctx->params.mtn_tab, iep2_mtn_tab, sizeof(ctx->params.mtn_tab));

    ctx->params.roi_en = 0;
    ctx->params.roi_layer_num = 0;

    ctx->params.dil_mode = IEP2_DIL_MODE_I1O1T;
    ctx->params.src_fmt = IEP2_FMT_YUV420;
    ctx->params.src_yuv_swap = IEP2_YUV_SWAP_SP_UV;
    ctx->params.dst_fmt = IEP2_FMT_YUV420;
    ctx->params.dst_yuv_swap = IEP2_YUV_SWAP_SP_UV;
    ctx->params.src_y_stride = 720 / 4;
    ctx->params.src_uv_stride = 720 / 4;
    ctx->params.dst_y_stride = 720 / 4;
    ctx->params.tile_cols = 720 / 16;
    ctx->params.tile_rows = 480 / 4;

    memset(&ctx->ff_inf, 0, sizeof(ctx->ff_inf));

    memset(&ctx->pd_inf, 0, sizeof(ctx->pd_inf));
    ctx->pd_inf.pdtype = PD_TYPES_UNKNOWN;
    ctx->pd_inf.step = -1;

    ret = mpp_buffer_group_get_internal(&ctx->memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        close(ctx->fd);
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        return ret;
    }

    ret = mpp_buffer_get(ctx->memGroup, &ctx->mv_buf,
                         IEP2_TILE_W_MAX * IEP2_TILE_H_MAX);
    if (ret) {
        close(ctx->fd);
        mpp_buffer_group_put(ctx->memGroup);
        mpp_err_f("allocate mv buffer failed\n");
        return MPP_NOK;
    }

    ret = mpp_buffer_get(ctx->memGroup, &ctx->md_buf, 1920 * 1088);
    if (ret) {
        close(ctx->fd);
        mpp_buffer_group_put(ctx->memGroup);
        mpp_buffer_put(ctx->mv_buf);
        mpp_err_f("allocate md buffer failed\n");
        return MPP_NOK;
    }

    ctx->params.mv_addr = mpp_buffer_get_fd(ctx->mv_buf);
    ctx->params.md_addr = mpp_buffer_get_fd(ctx->md_buf);

    return MPP_OK;
}